

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O0

void deqp::gls::InteractionTestUtil::computeRandomRenderCommands
               (Random *rnd,ApiType apiType,int numCommands,int targetW,int targetH,
               vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
               *dst)

{
  bool bVar1;
  pointer pRVar2;
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_40;
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_38;
  iterator cmd;
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  *dst_local;
  int targetH_local;
  int targetW_local;
  int numCommands_local;
  Random *rnd_local;
  ApiType apiType_local;
  
  cmd._M_current = (RenderCommand *)dst;
  std::
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ::resize(dst,(long)numCommands);
  local_38._M_current =
       (RenderCommand *)
       std::
       vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
       ::begin(cmd._M_current);
  while( true ) {
    local_40._M_current =
         (RenderCommand *)
         std::
         vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
         ::end(cmd._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
             ::operator->(&local_38);
    computeRandomRenderState(rnd,&pRVar2->state,apiType,targetW,targetH);
    pRVar2 = __gnu_cxx::
             __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
             ::operator->(&local_38);
    computeRandomQuad(rnd,&pRVar2->quad,targetW,targetH);
    __gnu_cxx::
    __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
    ::operator++(&local_38,0);
  }
  return;
}

Assistant:

void computeRandomRenderCommands (de::Random& rnd, glu::ApiType apiType, int numCommands, int targetW, int targetH, vector<RenderCommand>& dst)
{
	DE_ASSERT(dst.empty());

	dst.resize(numCommands);
	for (vector<RenderCommand>::iterator cmd = dst.begin(); cmd != dst.end(); cmd++)
	{
		computeRandomRenderState(rnd, cmd->state, apiType, targetW, targetH);
		computeRandomQuad(rnd, cmd->quad, targetW, targetH);
	}
}